

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXcFramework.cxx
# Opt level: O2

cmXcFrameworkPlistLibrary * __thiscall
cmXcFrameworkPlist::SelectSuitableLibrary
          (cmXcFrameworkPlist *this,cmMakefile *mf,cmListFileBacktrace *bt)

{
  bool bVar1;
  cmXcFrameworkPlistLibrary *pcVar2;
  bool bVar3;
  __type _Var4;
  string *psVar5;
  cmake *this_00;
  cmXcFrameworkPlistLibrary *lib;
  cmXcFrameworkPlistLibrary *pcVar6;
  allocator<char> local_91;
  cmXcFrameworkPlistLibrary *local_90;
  string supportedSystemName;
  string systemName;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&supportedSystemName,"CMAKE_SYSTEM_NAME",&local_91);
  psVar5 = cmMakefile::GetSafeDefinition(mf,&supportedSystemName);
  std::__cxx11::string::string((string *)&systemName,(string *)psVar5);
  std::__cxx11::string::~string((string *)&supportedSystemName);
  bVar3 = cmMakefile::PlatformIsAppleSimulator(mf);
  pcVar6 = (this->AvailableLibraries).
           super__Vector_base<cmXcFrameworkPlistLibrary,_std::allocator<cmXcFrameworkPlistLibrary>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (this->AvailableLibraries).
           super__Vector_base<cmXcFrameworkPlistLibrary,_std::allocator<cmXcFrameworkPlistLibrary>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pcVar6 == pcVar2) {
      this_00 = cmMakefile::GetCMakeInstance(mf);
      local_91 = (allocator<char>)0x22;
      cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[19],std::__cxx11::string&,char>
                (&supportedSystemName,(char (*) [39])"Unable to find suitable library in:\n  ",
                 &this->Path,(char (*) [19])"\nfor system name \"",&systemName,(char *)&local_91);
      cmake::IssueMessage(this_00,FATAL_ERROR,&supportedSystemName,bt);
      std::__cxx11::string::~string((string *)&supportedSystemName);
      local_90 = (cmXcFrameworkPlistLibrary *)0x0;
      break;
    }
    supportedSystemName._M_dataplus._M_p = (pointer)&supportedSystemName.field_2;
    supportedSystemName._M_string_length = 0;
    supportedSystemName.field_2._M_local_buf[0] = '\0';
    if (pcVar6->SupportedPlatform < (visionOS|iOS)) {
      std::__cxx11::string::assign((char *)&supportedSystemName);
    }
    _Var4 = std::operator==(&systemName,&supportedSystemName);
    if (_Var4) {
      bVar1 = (pcVar6->SupportedPlatformVariant).
              super__Optional_base<cmXcFrameworkPlistSupportedPlatformVariant,_true,_true>.
              _M_payload.super__Optional_payload_base<cmXcFrameworkPlistSupportedPlatformVariant>.
              _M_engaged;
      if (bVar1 == bVar3 && bVar3) {
        if ((pcVar6->SupportedPlatformVariant).
            super__Optional_base<cmXcFrameworkPlistSupportedPlatformVariant,_true,_true>._M_payload.
            super__Optional_payload_base<cmXcFrameworkPlistSupportedPlatformVariant>._M_payload.
            _M_value != simulator) goto LAB_002267b8;
      }
      else if (bVar1 != bVar3) goto LAB_002267b8;
      bVar1 = false;
      local_90 = pcVar6;
    }
    else {
LAB_002267b8:
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)&supportedSystemName);
    pcVar6 = pcVar6 + 1;
  } while (bVar1);
  std::__cxx11::string::~string((string *)&systemName);
  return local_90;
}

Assistant:

const cmXcFrameworkPlistLibrary* cmXcFrameworkPlist::SelectSuitableLibrary(
  const cmMakefile& mf, const cmListFileBacktrace& bt) const
{
  auto systemName = mf.GetSafeDefinition("CMAKE_SYSTEM_NAME");
  cm::optional<cmXcFrameworkPlistSupportedPlatformVariant> systemVariant;
  if (mf.PlatformIsAppleSimulator()) {
    systemVariant = cmXcFrameworkPlistSupportedPlatformVariant::simulator;
  }

  for (auto const& lib : this->AvailableLibraries) {
    std::string supportedSystemName;
    switch (lib.SupportedPlatform) {
      case cmXcFrameworkPlistSupportedPlatform::macOS:
        supportedSystemName = "Darwin";
        break;
      case cmXcFrameworkPlistSupportedPlatform::iOS:
        supportedSystemName = "iOS";
        break;
      case cmXcFrameworkPlistSupportedPlatform::tvOS:
        supportedSystemName = "tvOS";
        break;
      case cmXcFrameworkPlistSupportedPlatform::watchOS:
        supportedSystemName = "watchOS";
        break;
      case cmXcFrameworkPlistSupportedPlatform::visionOS:
        supportedSystemName = "visionOS";
        break;
    }

    if (systemName == supportedSystemName &&
        systemVariant == lib.SupportedPlatformVariant) {
      return &lib;
    }
  }

  mf.GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR,
    cmStrCat("Unable to find suitable library in:\n  ", this->Path,
             "\nfor system name \"", systemName, '"'),
    bt);
  return nullptr;
}